

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pool.cpp
# Opt level: O2

string * __thiscall xmrig::Pool::printableName_abi_cxx11_(string *__return_storage_ptr__,Pool *this)

{
  bool bVar1;
  int __val;
  allocator local_f9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  string local_98;
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  bVar1 = isEnabled(this);
  if (bVar1) {
    bVar1 = isTLS(this);
    __val = (uint)!bVar1 * 4 + 0x20;
  }
  else {
    __val = 0x1f;
  }
  std::__cxx11::to_string(&local_98,__val);
  std::operator+(&local_f8,"\x1b[1;",&local_98);
  std::operator+(&local_d8,&local_f8,"m");
  std::operator+(&local_b8,&local_d8,(this->m_url).m_url.m_data);
  std::operator+(__return_storage_ptr__,&local_b8,"\x1b[0m");
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_98);
  if (this->m_mode == MODE_SELF_SELECT) {
    std::__cxx11::string::string((string *)&local_58," self-select ",&local_f9);
    std::operator+(&local_38,&local_58,"\x1b[1;");
    std::__cxx11::to_string(&local_78,((this->m_daemon).m_tls ^ 1) * 4 + 0x20);
    std::operator+(&local_98,&local_38,&local_78);
    std::operator+(&local_f8,&local_98,"m");
    std::operator+(&local_d8,&local_f8,(this->m_daemon).m_url.m_data);
    std::operator+(&local_b8,&local_d8,"\x1b[0m");
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_58);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string xmrig::Pool::printableName() const
{
    std::string out(CSI "1;" + std::to_string(isEnabled() ? (isTLS() ? 32 : 36) : 31) + "m" + url().data() + CLEAR);

    if (m_mode == MODE_SELF_SELECT) {
        out += std::string(" self-select ") + CSI "1;" + std::to_string(m_daemon.isTLS() ? 32 : 36) + "m" + m_daemon.url().data() + CLEAR;
    }

    return out;
}